

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

int duckdb::TryCastCInternal<char*,int,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
              (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  int result_value;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  bVar1 = FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,int>
                    (*(char **)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_4);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = local_4;
  }
  return iVar2;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}